

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgknl(fitsfile *fptr,char *keyname,int nstart,int nmax,int *value,int *nfound,int *status)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *equalssign;
  char comm [73];
  char svalue [71];
  char local_118 [8];
  char card [81];
  char keyindex [8];
  char keyroot [75];
  long local_60;
  long ival;
  int local_50;
  int undefinedval;
  int tstatus;
  int mkeys;
  int nkeys;
  int ii;
  int lenroot;
  int nend;
  int *nfound_local;
  int *value_local;
  int nmax_local;
  int nstart_local;
  char *keyname_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    *nfound = 0;
    ii = nstart + nmax + -1;
    keyindex[0] = '\0';
    _lenroot = nfound;
    nfound_local = value;
    value_local._0_4_ = nmax;
    value_local._4_4_ = nstart;
    _nmax_local = keyname;
    keyname_local = (char *)fptr;
    strncat(keyindex,keyname,0x4a);
    sVar2 = strlen(keyindex);
    nkeys = (int)sVar2;
    if ((int)sVar2 == 0) {
      fptr_local._4_4_ = *status;
    }
    else {
      for (mkeys = 0; mkeys < nkeys; mkeys = mkeys + 1) {
        iVar1 = toupper((int)keyindex[mkeys]);
        keyindex[mkeys] = (char)iVar1;
      }
      ffghps((fitsfile *)keyname_local,&tstatus,&undefinedval,status);
      ffmaky((fitsfile *)keyname_local,3,status);
      ival._4_4_ = 0;
      for (mkeys = 3; mkeys <= tstatus; mkeys = mkeys + 1) {
        iVar1 = ffgnky((fitsfile *)keyname_local,local_118,status);
        if (0 < iVar1) {
          return *status;
        }
        iVar1 = strncmp(keyindex,local_118,(long)nkeys);
        if (iVar1 == 0) {
          card[0x50] = '\0';
          pcVar3 = strchr(local_118,0x3d);
          if (pcVar3 != (char *)0x0) {
            if (7 < (long)(pcVar3 + (-(long)nkeys - (long)local_118))) {
              *status = 0xcf;
              return 0xcf;
            }
            strncat(card + 0x50,local_118 + nkeys,
                    (size_t)(pcVar3 + (-(long)nkeys - (long)local_118)));
            local_50 = 0;
            iVar1 = ffc2ii(card + 0x50,&local_60,&local_50);
            if (((iVar1 < 1) && (local_60 <= ii)) && (value_local._4_4_ <= local_60)) {
              ffpsvc(local_118,comm + 0x48,(char *)&equalssign,status);
              ffc2l(comm + 0x48,nfound_local + (local_60 - value_local._4_4_),status);
              if ((long)*_lenroot < (local_60 - value_local._4_4_) + 1) {
                *_lenroot = ((int)local_60 - value_local._4_4_) + 1;
              }
              if (*status == 0xcc) {
                ival._4_4_ = 1;
                *status = 0;
              }
            }
          }
        }
      }
      if ((ival._4_4_ != 0) && (*status < 1)) {
        *status = 0xcc;
      }
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgknl( fitsfile *fptr,     /* I - FITS file pointer                    */
            const char *keyname,      /* I - root name of keywords to read        */
            int  nstart,        /* I - starting index number                */
            int  nmax,          /* I - maximum number of keywords to return */
            int  *value,        /* O - array of keyword values              */
            int  *nfound,       /* O - number of values that were returned  */
            int  *status)       /* IO - error status                        */
/*
  Read (get) an indexed array of keywords with index numbers between
  NSTART and (NSTART + NMAX -1) inclusive.  
  The returned value = 1 if the keyword is true, else = 0 if false.
*/
{
    int nend, lenroot, ii, nkeys, mkeys, tstatus, undefinedval;
    long ival;
    char keyroot[FLEN_KEYWORD], keyindex[8], card[FLEN_CARD];
    char svalue[FLEN_VALUE], comm[FLEN_COMMENT], *equalssign;

    if (*status > 0)
        return(*status);

    *nfound = 0;
    nend = nstart + nmax - 1;

    keyroot[0] = '\0';
    strncat(keyroot, keyname, FLEN_KEYWORD - 1);

    lenroot = strlen(keyroot);
    
    if (lenroot == 0)     /*  root must be at least 1 char long  */
        return(*status);
 
    for (ii=0; ii < lenroot; ii++)           /*  make sure upper case  */
        keyroot[ii] = toupper(keyroot[ii]);

    ffghps(fptr, &nkeys, &mkeys, status);  /*  get the number of keywords  */

    ffmaky(fptr, 3, status);  /* move to 3rd keyword (skip 1st 2 keywords) */

    undefinedval = FALSE;
    for (ii=3; ii <= nkeys; ii++)  
    {
       if (ffgnky(fptr, card, status) > 0)     /*  get next keyword  */
           return(*status);

       if (strncmp(keyroot, card, lenroot) == 0)  /* see if keyword matches */
       {
          keyindex[0] = '\0';
          equalssign = strchr(card, '=');
	  if (equalssign == 0) continue;  /* keyword has no value */

          if (equalssign - card - lenroot > 7)
          {
             return (*status=BAD_KEYCHAR);
          }
          strncat(keyindex, &card[lenroot], equalssign - card  - lenroot);  /*  copy suffix  */

          tstatus = 0;
          if (ffc2ii(keyindex, &ival, &tstatus) <= 0)    /*  test suffix  */
          {
             if (ival <= nend && ival >= nstart)
             {
                ffpsvc(card, svalue, comm, status);   /*  parse the value */
                ffc2l(svalue, &value[ival-nstart], status); /* convert*/
                if (ival - nstart + 1 > *nfound)
                      *nfound = ival - nstart + 1;  /*  max found */ 

                if (*status == VALUE_UNDEFINED)
                {
                    undefinedval = TRUE;
                   *status = 0;  /* reset status to read remaining values */
                }
             }
          }
       }
    }
    if (undefinedval && (*status <= 0) )
        *status = VALUE_UNDEFINED;  /* report at least 1 value undefined */

    return(*status);
}